

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall AbstractModuleClient::destroyHardwareConnection(AbstractModuleClient *this)

{
  allocator local_61;
  string local_60 [16];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  AbstractModuleClient *in_stack_ffffffffffffffc0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Trodes",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"HUPD",&local_61);
  unsubscribeFromEvent
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  MlmWrap::destroy_hardware_connection((MlmWrap *)0x1c0db2);
  return;
}

Assistant:

void AbstractModuleClient::destroyHardwareConnection(){
    unsubscribeFromEvent(TRODES_NETWORK_ID, hardware_update);
    destroy_hardware_connection();
}